

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.c
# Opt level: O2

void sysbvm_errorWithMessageTuple(sysbvm_tuple_t message)

{
  sysbvm_context_t *context;
  sysbvm_tuple_t exception;
  
  context = sysbvm_stackFrame_getActiveContext();
  if (context != (sysbvm_context_t *)0x0) {
    exception = sysbvm_error_createWithMessageText(context,message);
    sysbvm_exception_signal(context,exception);
    return;
  }
  fwrite("Cannot raise error with the specified message.\n",0x2f,1,_stderr);
  abort();
}

Assistant:

SYSBVM_API void sysbvm_errorWithMessageTuple(sysbvm_tuple_t message)
{
    sysbvm_context_t *activeContext = sysbvm_stackFrame_getActiveContext();
    if(!activeContext)
    {
        fprintf(stderr, "Cannot raise error with the specified message.\n");
        abort();
    }

    sysbvm_tuple_t errorException = sysbvm_error_createWithMessageText(activeContext, message);
    sysbvm_exception_signal(activeContext, errorException);
}